

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execExgDxDy<(moira::Instr)63,(moira::Mode)12,(moira::Size)4>(Moira *this,u16 opcode)

{
  ushort in_SI;
  Moira *in_RDI;
  int dst;
  int src;
  
  std::swap<unsigned_int>
            ((uint *)((long)in_RDI->exec + (long)(int)(in_SI & 7) * 4 + -0x58),
             (uint *)((long)in_RDI->exec + (long)(int)((int)(uint)in_SI >> 9 & 7) * 4 + -0x58));
  prefetch<4ul>(in_RDI);
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
  return;
}

Assistant:

void
Moira::execExgDxDy(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    std::swap(reg.d[src], reg.d[dst]);
    prefetch<POLLIPL>();

    sync(2);
}